

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.cpp
# Opt level: O0

bool __thiscall mahjong::Pair::isValueTiles(Pair *this,WiningState *state)

{
  bool bVar1;
  const_reference pvVar2;
  Tile local_30;
  IsSame local_29;
  Tile local_28;
  IsSame local_22;
  IsDragon local_21;
  WiningState *local_20;
  WiningState *state_local;
  Pair *this_local;
  
  local_20 = state;
  state_local = (WiningState *)this;
  pvVar2 = std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::front(&this->tiles);
  bVar1 = IsDragon::operator()(&local_21,pvVar2);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    pvVar2 = std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::front(&this->tiles);
    local_28 = WiningState::roundWind(local_20);
    bVar1 = IsSame::operator()(&local_22,pvVar2,&local_28);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      pvVar2 = std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::front(&this->tiles);
      local_30 = WiningState::seatWind(local_20);
      bVar1 = IsSame::operator()(&local_29,pvVar2,&local_30);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Pair::isValueTiles(const WiningState& state) const
{
	if (IsDragon()(tiles.front())) return true;
	if (IsSame()(tiles.front(), state.roundWind())) return true;
	if (IsSame()(tiles.front(), state.seatWind())) return true;

	return false;
}